

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::QueryAPICase::iterate(QueryAPICase *this)

{
  EGLenum EVar1;
  bool bVar2;
  EGLenum EVar3;
  Library *egl_00;
  NativeDisplay *nativeDisplay;
  EGLDisplay display_00;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  byte local_869;
  bool local_855;
  Enum<int,_2UL> local_838;
  MessageBuilder local_828;
  MessageBuilder local_6a8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_528;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_520;
  MessageBuilder local_518;
  EGLenum local_398;
  int local_394;
  EGLenum api_1;
  int ndx;
  int local_20c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_208;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_200;
  MessageBuilder local_1f8;
  int local_74;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  EGLenum local_60;
  EGLenum api;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> supportedAPIs;
  EGLenum apis [3];
  TestLog *log;
  EGLDisplay display;
  Library *egl;
  QueryAPICase *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  display_00 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x30a0000030a2;
  eglu::getClientAPIs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,egl_00,
                      display_00);
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
  local_60 = eglu::CallLogWrapper::eglQueryAPI(&this->super_CallLogWrapper);
  local_855 = false;
  if (local_60 != 0x30a0) {
    local_68._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    local_70._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    local_74 = 0x30a0;
    local_855 = de::
                contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                          (&local_68,&local_70,&local_74);
  }
  if (local_855 == false) {
    local_869 = 0;
    if (local_60 != 0x3038) {
      local_200._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      local_208._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      local_20c = 0x30a0;
      bVar2 = de::
              contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                        (&local_200,&local_208,&local_20c);
      local_869 = bVar2 ^ 0xff;
    }
    if ((local_869 & 1) != 0) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&api_1,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&api_1,
                          (char (*) [72])
                          "  Fail, initial value should be EGL_NONE if OpenGL ES is not supported.")
      ;
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&api_1);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid default value");
    }
  }
  else {
    tcu::TestLog::operator<<(&local_1f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1f8,
                        (char (*) [77])
                        "  Fail, initial value should be EGL_OPENGL_ES_API if OpenGL ES is supported."
                       );
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid default value");
  }
  for (local_394 = 0; local_394 < 3; local_394 = local_394 + 1) {
    local_398 = apis[(long)local_394 + -2];
    tcu::TestLog::operator<<(&local_518,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<(&local_518,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_518);
    local_520._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    local_528._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                      (&local_520,&local_528,&local_398);
    if (bVar2) {
      (**egl_00->_vptr_Library)();
      EVar1 = local_398;
      EVar3 = (*egl_00->_vptr_Library[0x28])();
      if (EVar1 != EVar3) {
        tcu::TestLog::operator<<(&local_6a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_6a8,
                            (char (*) [58])
                            "  Fail, return value does not match previously bound API.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6a8);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid return value");
      }
    }
    else {
      tcu::TestLog::operator<<(&local_828,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      EVar5 = eglu::getAPIStr(local_398);
      local_838.m_getName = EVar5.m_getName;
      local_838.m_value = EVar5.m_value;
      pMVar4 = tcu::MessageBuilder::operator<<(&local_828,&local_838);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])0x2b582ae);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_828);
    }
  }
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
  eglu::CallLogWrapper::eglTerminate(&this->super_CallLogWrapper,display_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const Library&			egl				= m_eglTestCtx.getLibrary();
		EGLDisplay				display			= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
		tcu::TestLog&			log				= m_testCtx.getLog();
		const EGLenum			apis[]			= { EGL_OPENGL_API, EGL_OPENGL_ES_API, EGL_OPENVG_API };
		const vector<EGLenum>	supportedAPIs	= eglu::getClientAPIs(egl, display);

		enableLogging(true);

		{
			const EGLenum	api	= eglQueryAPI();

			if (api != EGL_OPENGL_ES_API && (de::contains(supportedAPIs.begin(), supportedAPIs.end(), EGL_OPENGL_ES_API)))
			{
				log << TestLog::Message << "  Fail, initial value should be EGL_OPENGL_ES_API if OpenGL ES is supported." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid default value");
			}
			else if (api != EGL_NONE && !(de::contains(supportedAPIs.begin(), supportedAPIs.end(), EGL_OPENGL_ES_API)))
			{
				log << TestLog::Message << "  Fail, initial value should be EGL_NONE if OpenGL ES is not supported." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid default value");
			}
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(apis); ndx++)
		{
			const EGLenum	api	= apis[ndx];

			log << TestLog::Message << TestLog::EndMessage;

			if (de::contains(supportedAPIs.begin(), supportedAPIs.end(), api))
			{
				egl.bindAPI(api);

				if (api != egl.queryAPI())
				{
					log << TestLog::Message << "  Fail, return value does not match previously bound API." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid return value");
				}
			}
			else
			{
				log << TestLog::Message << eglu::getAPIStr(api) << " not supported." << TestLog::EndMessage;
			}
		}

		enableLogging(false);
		eglTerminate(display);
		return STOP;
	}